

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O1

void evp_pkey_set_method(EVP_PKEY *pkey,EVP_PKEY_ASN1_METHOD *method)

{
  _func_void_EVP_PKEY_ptr *p_Var1;
  
  if ((pkey->ameth != (EVP_PKEY_ASN1_METHOD *)0x0) &&
     (p_Var1 = pkey->ameth->pkey_free, p_Var1 != (_func_void_EVP_PKEY_ptr *)0x0)) {
    (*p_Var1)(pkey);
    pkey->pkey = (void *)0x0;
    pkey->type = 0;
  }
  pkey->ameth = method;
  pkey->type = method->pkey_id;
  return;
}

Assistant:

void evp_pkey_set_method(EVP_PKEY *pkey, const EVP_PKEY_ASN1_METHOD *method) {
  free_it(pkey);
  pkey->ameth = method;
  pkey->type = pkey->ameth->pkey_id;
}